

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
               (long *values,bool *validity,bitpacking_width_t width,long frame_of_reference,
               idx_t count,void *data_ptr)

{
  BitpackingCompressionState<long,_true,_long> *state_00;
  long in_RCX;
  byte in_DL;
  BitpackingCompressionState<long,_true,_long> *in_R9;
  idx_t bp_size;
  BitpackingCompressionState<long,_true,_long> *state;
  bitpacking_width_t in_stack_000000cf;
  idx_t in_stack_000000d0;
  long *in_stack_000000d8;
  data_ptr_t in_stack_000000e0;
  undefined7 in_stack_ffffffffffffffb8;
  bitpacking_width_t in_stack_ffffffffffffffbf;
  idx_t in_stack_ffffffffffffffc0;
  BitpackingCompressionState<long,_true,_long> *state_01;
  
  state_01 = in_R9;
  state_00 = (BitpackingCompressionState<long,_true,_long> *)
             BitpackingPrimitives::GetRequiredSize
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  ReserveSpace(state_00,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  WriteMetaData(state_01,(BitpackingMode)((ulong)in_R9 >> 0x38));
  WriteData<long>(&in_R9->data_ptr,in_RCX);
  WriteData<long>(&in_R9->data_ptr,(ulong)in_DL);
  BitpackingPrimitives::PackBuffer<long,false>
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cf);
  in_R9->data_ptr = in_R9->data_ptr + (long)(&state_00->state + -1) + 0x8818;
  UpdateStats(state_00,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}